

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void xor_test(void)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  bitset_container_t *src_1;
  bitset_container_t *src_2;
  bitset_container_t *container2;
  bitset_container_t *dst;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  src_1 = bitset_container_create();
  src_2 = bitset_container_create();
  container2 = bitset_container_create();
  dst = bitset_container_create();
  _assert_true((unsigned_long)src_1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xc9);
  _assert_true((unsigned_long)src_2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xca);
  _assert_true((unsigned_long)container2,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xcb);
  _assert_true((unsigned_long)dst,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xcc);
  puVar1 = src_1->words;
  puVar2 = container2->words;
  uVar7 = 0xfffffffffffffffd;
  do {
    uVar7 = uVar7 + 3;
    uVar8 = uVar7 >> 6;
    uVar3 = puVar1[uVar8];
    uVar10 = uVar3 | 1L << (uVar7 & 0x3f);
    src_1->cardinality = src_1->cardinality + (int)((uVar3 ^ uVar10) >> ((byte)uVar7 & 0x3f));
    puVar1[uVar8] = uVar10;
    uVar3 = puVar2[uVar8];
    uVar10 = uVar3 | 1L << (uVar7 & 0x3f);
    container2->cardinality =
         container2->cardinality + (int)((uVar3 ^ uVar10) >> ((byte)uVar7 & 0x3f));
    puVar2[uVar8] = uVar10;
  } while (uVar7 < 0xfffd);
  puVar1 = src_2->words;
  puVar2 = container2->words;
  uVar7 = 0xffffffffffffffc2;
  do {
    uVar7 = uVar7 + 0x3e;
    uVar8 = uVar7 >> 6;
    uVar3 = puVar1[uVar8];
    bVar6 = (byte)uVar7 & 0x3e;
    uVar10 = uVar3 | 1L << bVar6;
    src_2->cardinality = src_2->cardinality + (int)((uVar3 ^ uVar10) >> bVar6);
    puVar1[uVar8] = uVar10;
    uVar3 = puVar2[uVar8];
    uVar10 = uVar3 | 1L << bVar6;
    container2->cardinality = container2->cardinality + (int)((uVar3 ^ uVar10) >> bVar6);
    puVar2[uVar8] = uVar10;
  } while (uVar7 < 0xffc2);
  puVar1 = container2->words;
  iVar5 = container2->cardinality;
  uVar7 = 0xffffffffffffff46;
  do {
    uVar7 = uVar7 + 0xba;
    uVar3 = puVar1[uVar7 >> 6];
    uVar9 = (uint)uVar7 & 0x3e;
    iVar5 = iVar5 - (uint)((uVar3 >> uVar9 & 1) != 0);
    puVar1[uVar7 >> 6] = uVar3 & ~(1L << uVar9);
  } while (uVar7 < 0xff46);
  container2->cardinality = iVar5;
  bitset_container_xor(src_1,src_2,dst);
  _Var4 = bitset_container_equals(dst,container2);
  _assert_true((ulong)_Var4,"bitset_container_equals(TMP, BI)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xde);
  bitset_container_free(src_1);
  bitset_container_free(src_2);
  bitset_container_free(container2);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(xor_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 3) {
        bitset_container_remove(BI, x);
    }

    bitset_container_xor(B1, B2, TMP);
    assert_true(bitset_container_equals(TMP, BI));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}